

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWriteNodeIntStruct(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover,char *pStr)

{
  word wVar1;
  word *pwVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  char *pcVar8;
  void **ppvVar9;
  int nLutRoot;
  uint uVar10;
  ulong uVar11;
  word (*pawVar12) [1024];
  int iVar13;
  int nLutLeaf;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  word Func1;
  word Func0;
  word Func2;
  char pLut2 [32];
  char pLut1 [32];
  char pLut0 [32];
  word pRes [1024];
  word pCube [1024];
  
  uVar4 = (pNode->vFanins).nSize;
  sVar5 = strlen(pStr);
  iVar3 = (int)sVar5;
  if (iVar3 - 4U < 0xfffffffe) {
    printf("Wrong LUT struct (%s)\n",pStr);
    return;
  }
  uVar11 = 0;
  while ((sVar5 & 0xffffffff) != uVar11) {
    pcVar6 = pStr + uVar11;
    uVar11 = uVar11 + 1;
    if ((byte)(*pcVar6 - 0x37U) < 0xfc) {
      printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)*pcVar6 - 0x30));
      return;
    }
  }
  iVar16 = 0;
  if (iVar3 == 3) {
    iVar16 = pStr[1] + -0x30;
  }
  iVar13 = iVar16 + -1;
  if (iVar16 == 0) {
    iVar13 = 0;
  }
  if ((int)pStr[iVar3 - 1] + iVar13 + *pStr + -0x61 < (int)uVar4) {
    printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)uVar4,pStr);
    return;
  }
  nLutLeaf = *pStr + -0x30;
  nLutRoot = pStr[iVar3 - 1] + -0x30;
  fputc(10,(FILE *)pFile);
  iVar13 = nLutRoot;
  if (nLutRoot < nLutLeaf) {
    iVar13 = nLutLeaf;
  }
  if (iVar13 < iVar16) {
    iVar13 = iVar16;
  }
  if ((int)uVar4 <= iVar13) {
    fwrite(".names",6,1,(FILE *)pFile);
    for (lVar17 = 0; ppvVar9 = pNode->pNtk->vObjs->pArray, lVar17 < (pNode->vFanins).nSize;
        lVar17 = lVar17 + 1) {
      pcVar6 = Abc_ObjName((Abc_Obj_t *)ppvVar9[(pNode->vFanins).pArray[lVar17]]);
      fprintf((FILE *)pFile," %s",pcVar6);
    }
    pcVar6 = Abc_ObjName((Abc_Obj_t *)ppvVar9[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s\n",pcVar6);
    fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
    return;
  }
  pLut2[0x10] = '\0';
  pLut2[0x11] = '\0';
  pLut2[0x12] = '\0';
  pLut2[0x13] = '\0';
  pLut2[0x14] = '\0';
  pLut2[0x15] = '\0';
  pLut2[0x16] = '\0';
  pLut2[0x17] = '\0';
  pLut2[0x18] = '\0';
  pLut2[0x19] = '\0';
  pLut2[0x1a] = '\0';
  pLut2[0x1b] = '\0';
  pLut2[0x1c] = '\0';
  pLut2[0x1d] = '\0';
  pLut2[0x1e] = '\0';
  pLut2[0x1f] = '\0';
  pLut2[0] = '\0';
  pLut2[1] = '\0';
  pLut2[2] = '\0';
  pLut2[3] = '\0';
  pLut2[4] = '\0';
  pLut2[5] = '\0';
  pLut2[6] = '\0';
  pLut2[7] = '\0';
  pLut2[8] = '\0';
  pLut2[9] = '\0';
  pLut2[10] = '\0';
  pLut2[0xb] = '\0';
  pLut2[0xc] = '\0';
  pLut2[0xd] = '\0';
  pLut2[0xe] = '\0';
  pLut2[0xf] = '\0';
  if (Io_NtkWriteNodeIntStruct::TruthStore[0][0] == 0) {
    lVar17 = 6;
    pawVar12 = Io_NtkWriteNodeIntStruct::TruthStore;
    for (lVar14 = 0; lVar14 != 0x80; lVar14 = lVar14 + 8) {
      *(word (**) [1024])((long)Io_NtkWriteNodeIntStruct::pTruths + lVar14) = pawVar12;
      pawVar12 = pawVar12 + 1;
    }
    for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
      wVar1 = Io_NtkWriteNodeIntStruct::Truth6[lVar14];
      pwVar2 = Io_NtkWriteNodeIntStruct::pTruths[lVar14];
      for (lVar15 = 0; lVar15 != 0x400; lVar15 = lVar15 + 1) {
        pwVar2[lVar15] = wVar1;
      }
    }
    for (; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      pwVar2 = Io_NtkWriteNodeIntStruct::pTruths[lVar17];
      for (lVar14 = 0; lVar14 != 0x400; lVar14 = lVar14 + 1) {
        pwVar2[lVar14] = -(ulong)((1 << ((char)lVar17 - 6U & 0x1f) & (uint)lVar14) != 0);
      }
    }
  }
  Abc_SopToTruthBig((char *)(pNode->field_5).pData,uVar4,Io_NtkWriteNodeIntStruct::pTruths,pCube,
                    pRes);
  iVar13 = Kit_TruthIsConst0((uint *)pRes,uVar4);
  if ((iVar13 != 0) || (iVar13 = Kit_TruthIsConst1((uint *)pRes,uVar4), iVar13 != 0)) {
    pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    uVar4 = Kit_TruthIsConst1((uint *)pRes,uVar4);
    fprintf((FILE *)pFile,".names %s\n %d\n",pcVar6,(ulong)uVar4);
    return;
  }
  if (iVar3 == 2) {
    iVar16 = If_CluCheckExt((void *)0x0,pRes,uVar4,nLutLeaf,nLutRoot,pLut0,pLut1,&Func0,&Func1);
    if (iVar16 != 0) {
LAB_002e758e:
      fwrite(".names",6,1,(FILE *)pFile);
      for (lVar17 = 0; lVar17 < pLut1[0]; lVar17 = lVar17 + 1) {
        pcVar6 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[pLut1[lVar17 + 2]]])
        ;
        fprintf((FILE *)pFile," %s",pcVar6);
      }
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s_lut1\n",pcVar6);
      pcVar6 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func1,(int)pLut1[0],vCover);
      fputs(pcVar6,(FILE *)pFile);
      if ((iVar3 == 3) && ('\0' < pLut2[0])) {
        fwrite(".names",6,1,(FILE *)pFile);
        for (lVar17 = 0; lVar17 < pLut2[0]; lVar17 = lVar17 + 1) {
          if (uVar4 == (int)pLut2[lVar17 + 2]) {
            piVar7 = (pNode->vFanouts).pArray;
            pcVar6 = " %s_lut1";
          }
          else {
            piVar7 = (pNode->vFanins).pArray + (int)pLut2[lVar17 + 2];
            pcVar6 = " %s";
          }
          pcVar8 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar7]);
          fprintf((FILE *)pFile,pcVar6,pcVar8);
        }
        pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
        fprintf((FILE *)pFile," %s_lut2\n",pcVar6);
        pcVar6 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func2,(int)pLut2[0],vCover);
        fputs(pcVar6,(FILE *)pFile);
      }
      fwrite(".names",6,1,(FILE *)pFile);
      for (lVar17 = 0; lVar17 < pLut0[0]; lVar17 = lVar17 + 1) {
        uVar10 = (uint)pLut0[lVar17 + 2];
        if (uVar4 == uVar10) {
          piVar7 = (pNode->vFanouts).pArray;
          ppvVar9 = pNode->pNtk->vObjs->pArray;
          pcVar6 = " %s_lut1";
        }
        else {
          ppvVar9 = pNode->pNtk->vObjs->pArray;
          if (uVar4 + 1 == uVar10) {
            piVar7 = (pNode->vFanouts).pArray;
            pcVar6 = " %s_lut2";
          }
          else {
            piVar7 = (pNode->vFanins).pArray + (int)uVar10;
            pcVar6 = " %s";
          }
        }
        pcVar8 = Abc_ObjName((Abc_Obj_t *)ppvVar9[*piVar7]);
        fprintf((FILE *)pFile,pcVar6,pcVar8);
      }
      pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s\n",pcVar6);
      pcVar6 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func0,(int)pLut0[0],vCover);
      fputs(pcVar6,(FILE *)pFile);
      return;
    }
    Extra_PrintHex(_stdout,(uint *)pRes,uVar4);
    printf("    ");
  }
  else {
    iVar16 = If_CluCheckExt3((void *)0x0,pRes,uVar4,nLutLeaf,iVar16,nLutRoot,pLut0,pLut1,pLut2,
                             &Func0,&Func1,&Func2);
    if (iVar16 != 0) goto LAB_002e758e;
    Extra_PrintHex(_stdout,(uint *)pRes,uVar4);
    printf("    ");
  }
  Kit_DsdPrintFromTruth((uint *)pRes,uVar4);
  putchar(10);
  pcVar6 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar6);
  return;
}

Assistant:

void Io_NtkWriteNodeIntStruct( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover, char * pStr )
{
    Abc_Obj_t * pNet;
    int nLeaves = Abc_ObjFaninNum(pNode);
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return;
    }

    // consider easy case
    fprintf( pFile, "\n" );
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
        // get the output name
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
        return;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word pCube[1<<10], pRes[1<<10], Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0}, * pSop;
//        int nVarsMin[3], pVars[3][20];

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                ABC_CONST(0xAAAAAAAAAAAAAAAA),
                ABC_CONST(0xCCCCCCCCCCCCCCCC),
                ABC_CONST(0xF0F0F0F0F0F0F0F0),
                ABC_CONST(0xFF00FF00FF00FF00),
                ABC_CONST(0xFFFF0000FFFF0000),
                ABC_CONST(0xFFFFFFFF00000000)
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }

        // collect variables
//        Abc_ObjForEachFanin( pNode, pNet, i )
//            pVars[0][i] = pVars[1][i] = pVars[2][i] = i;

        // derive truth table
        Abc_SopToTruthBig( (char*)Abc_ObjData(pNode), nLeaves, pTruths, pCube, pRes );
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
            fprintf( pFile, ".names %s\n %d\n", Abc_ObjName(Abc_ObjFanout0(pNode)), Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            return;
        }

//        Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
//        Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );

        // perform decomposition
        if ( Length == 2 )
        {
            if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }
        else
        {
            if ( !If_CluCheckExt3( NULL, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }

        // write leaf node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut1[0]; i++ )
            fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut1[2+i])) );
        fprintf( pFile, " %s_lut1\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func1, pLut1[0], vCover );
        fprintf( pFile, "%s", pSop );

        if ( Length == 3 && pLut2[0] > 0 )
        {
            // write leaf node
            fprintf( pFile, ".names" );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    fprintf( pFile, " %s_lut1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                else
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut2[2+i])) );
            fprintf( pFile, " %s_lut2\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func2, pLut2[0], vCover );
            fprintf( pFile, "%s", pSop );
        }

        // write root node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                fprintf( pFile, " %s_lut1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            else if ( pLut0[2+i] == nLeaves+1 )
                fprintf( pFile, " %s_lut2", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            else
                fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pLut0[2+i])) );
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func0, pLut0[0], vCover );
        fprintf( pFile, "%s", pSop );
    }
}